

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
absl::lts_20250127::container_internal::
btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>
::init_leaf(btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>
            *this,field_type position,field_type max_count,
           btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>
           *parent)

{
  template_ElementType<0UL> *ppbVar1;
  template_ElementType<2UL> *ptVar2;
  
  ppbVar1 = btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,long>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>,256,false>>
            ::GetField<0ul>((btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,long>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>,256,false>>
                             *)this);
  *ppbVar1 = parent;
  ptVar2 = btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,long>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>,256,false>>
           ::GetField<2ul>((btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,long>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>,256,false>>
                            *)this);
  *ptVar2 = position;
  ptVar2 = btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,long>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>,256,false>>
           ::GetField<2ul>((btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,long>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>,256,false>>
                            *)this);
  ptVar2[1] = '\0';
  ptVar2 = btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,long>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>,256,false>>
           ::GetField<2ul>((btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,long>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>,256,false>>
                            *)this);
  ptVar2[2] = '\0';
  ptVar2 = btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,long>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>,256,false>>
           ::GetField<2ul>((btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,long>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>,256,false>>
                            *)this);
  ptVar2[3] = max_count;
  start_slot(this);
  return;
}

Assistant:

void init_leaf(field_type position, field_type max_count,
                 btree_node *parent) {
    set_generation(0);
    set_parent(parent);
    set_position(position);
    set_start(0);
    set_finish(0);
    set_max_count(max_count);
    absl::container_internal::SanitizerPoisonMemoryRegion(
        start_slot(), max_count * sizeof(slot_type));
  }